

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::ToUnscopablesWrapperObject(Var aRight,ScriptContext *scriptContext)

{
  RecyclableObject *wrappedObject;
  ThreadContext *threadContext;
  Recycler *pRVar1;
  UnscopablesWrapperObject *this;
  JavascriptLibrary *this_00;
  StaticType *type;
  TrackAllocData local_80;
  UnscopablesWrapperObject *local_58;
  UnscopablesWrapperObject *withWrapper;
  RecyclableObject *local_40;
  RecyclableObject *object;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&object,threadContext);
  local_40 = VarTo<Js::RecyclableObject>(aRight);
  pRVar1 = ScriptContext::GetRecycler((ScriptContext *)reentrancylock._24_8_);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_80,(type_info *)&UnscopablesWrapperObject::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
             ,0x2ac0);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_80);
  this = (UnscopablesWrapperObject *)new<Memory::Recycler>(0x18,pRVar1,0x43c4b0);
  wrappedObject = local_40;
  this_00 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
  type = JavascriptLibrary::GetWithType(this_00);
  UnscopablesWrapperObject::UnscopablesWrapperObject(this,wrappedObject,type);
  local_58 = this;
  JsReentLock::~JsReentLock((JsReentLock *)&object);
  return this;
}

Assistant:

Var JavascriptOperators::ToUnscopablesWrapperObject(Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_NewUnscopablesWrapperObject, reentrancylock, scriptContext->GetThreadContext());
        RecyclableObject* object = VarTo<RecyclableObject>(aRight);

        UnscopablesWrapperObject* withWrapper = RecyclerNew(scriptContext->GetRecycler(), UnscopablesWrapperObject, object, scriptContext->GetLibrary()->GetWithType());
        return withWrapper;
        JIT_HELPER_END(Op_NewUnscopablesWrapperObject);
    }